

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators)

{
  _Rb_tree_header *p_Var1;
  pointer ppcVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  pointer ppcVar4;
  cmGeneratorTarget *this_01;
  bool bVar5;
  bool bVar6;
  uint __val;
  char cVar7;
  bool globalAutogenTarget;
  bool globalAutoRccTarget;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char cVar11;
  TargetType TVar12;
  string *psVar13;
  char *pcVar14;
  cmQtAutoGenInitializer *this_02;
  uint uVar15;
  pointer ppcVar16;
  pointer ppcVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong in_R8;
  bool bVar19;
  bool moc;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  string targetName;
  string uicExec;
  string version;
  string msg;
  cmLocalGenerator *localGen;
  _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
  *local_d8;
  _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
  *local_d0;
  string *local_c8;
  string comp;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> local_a0;
  string rccExec;
  
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = (_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
              *)&this->GlobalAutoGenTargets_;
  p_Var1 = &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8 = (_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
              *)&this->GlobalAutoRccTargets_;
  p_Var1 = &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CompilerFeatures_)._M_h._M_buckets = &(this->CompilerFeatures_)._M_h._M_single_bucket;
  (this->CompilerFeatures_)._M_h._M_bucket_count = 1;
  (this->CompilerFeatures_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CompilerFeatures_)._M_h._M_element_count = 0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CompilerFeatures_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_c8 = &(this->Keywords_).AUTOMOC;
  Keywords::Keywords((Keywords *)local_c8);
  ppcVar16 = (localGenerators->
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar2 = (localGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar16 != ppcVar2) {
    do {
      paVar18 = &targetName.field_2;
      localGen = *ppcVar16;
      this_00 = localGen->Makefile;
      targetName._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetName,"CMAKE_GLOBAL_AUTOGEN_TARGET","");
      psVar13 = cmMakefile::GetSafeDefinition(this_00,&targetName);
      globalAutogenTarget = cmSystemTools::IsOn(psVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetName._M_dataplus._M_p != paVar18) {
        operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
      }
      if (globalAutogenTarget) {
        uicExec._M_dataplus._M_p = (pointer)&uicExec.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uicExec,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME","");
        psVar13 = cmMakefile::GetSafeDefinition(this_00,&uicExec);
        pcVar3 = (psVar13->_M_dataplus)._M_p;
        targetName._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetName,pcVar3,pcVar3 + psVar13->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uicExec._M_dataplus._M_p != &uicExec.field_2) {
          operator_delete(uicExec._M_dataplus._M_p,uicExec.field_2._M_allocated_capacity + 1);
        }
        if (targetName._M_string_length == 0) {
          in_R8 = 7;
          std::__cxx11::string::_M_replace((ulong)&targetName,0,(char *)0x0,0x53f695);
        }
        std::
        _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
        ::_M_emplace_unique<cmLocalGenerator*&,std::__cxx11::string>(local_d0,&localGen,&targetName)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetName._M_dataplus._M_p != paVar18) {
          operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
        }
      }
      targetName._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetName,"CMAKE_GLOBAL_AUTORCC_TARGET","");
      psVar13 = cmMakefile::GetSafeDefinition(this_00,&targetName);
      globalAutoRccTarget = cmSystemTools::IsOn(psVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetName._M_dataplus._M_p != paVar18) {
        operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
      }
      if (globalAutoRccTarget) {
        uicExec._M_dataplus._M_p = (pointer)&uicExec.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&uicExec,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME","");
        psVar13 = cmMakefile::GetSafeDefinition(this_00,&uicExec);
        pcVar3 = (psVar13->_M_dataplus)._M_p;
        targetName._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetName,pcVar3,pcVar3 + psVar13->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uicExec._M_dataplus._M_p != &uicExec.field_2) {
          operator_delete(uicExec._M_dataplus._M_p,uicExec.field_2._M_allocated_capacity + 1);
        }
        if (targetName._M_string_length == 0) {
          in_R8 = 7;
          std::__cxx11::string::_M_replace((ulong)&targetName,0,(char *)0x0,0x53f6b4);
        }
        std::
        _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
        ::_M_emplace_unique<cmLocalGenerator*&,std::__cxx11::string>(local_d8,&localGen,&targetName)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetName._M_dataplus._M_p != paVar18) {
          operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
        }
      }
      ppcVar4 = (localGen->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar17 = (localGen->GeneratorTargets).
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppcVar17 != ppcVar4;
          ppcVar17 = ppcVar17 + 1) {
        this_01 = *ppcVar17;
        TVar12 = cmGeneratorTarget::GetType(this_01);
        if ((TVar12 < UTILITY) && (bVar8 = cmGeneratorTarget::IsImported(this_01), !bVar8)) {
          bVar8 = cmGeneratorTarget::GetPropertyAsBool(this_01,local_c8);
          bVar9 = cmGeneratorTarget::GetPropertyAsBool(this_01,&(this->Keywords_).AUTOUIC);
          bVar10 = cmGeneratorTarget::GetPropertyAsBool(this_01,&(this->Keywords_).AUTORCC);
          if ((bVar8 || bVar9) || bVar10) {
            pcVar14 = cmGeneratorTarget::GetSafeProperty
                                (this_01,&(this->Keywords_).AUTOMOC_EXECUTABLE);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&targetName,pcVar14,(allocator<char> *)&uicExec);
            pcVar14 = cmGeneratorTarget::GetSafeProperty
                                (this_01,&(this->Keywords_).AUTOUIC_EXECUTABLE);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&uicExec,pcVar14,(allocator<char> *)&rccExec);
            pcVar14 = cmGeneratorTarget::GetSafeProperty
                                (this_01,&(this->Keywords_).AUTORCC_EXECUTABLE);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rccExec,pcVar14,(allocator<char> *)&msg);
            local_a0 = cmQtAutoGenInitializer::GetQtVersion(this_01);
            bVar20 = local_a0.first.Major - 4 < 3;
            bVar23 = rccExec._M_string_length != 0;
            bVar22 = uicExec._M_string_length != 0;
            bVar21 = targetName._M_string_length != 0;
            bVar19 = (!bVar20 && !bVar21) && bVar8;
            bVar6 = !bVar22;
            moc = (!bVar20 && bVar6) && bVar9;
            bVar5 = !bVar23;
            if (((moc) || (bVar19)) || ((!bVar20 && bVar5) && bVar10)) {
              msg._M_dataplus._M_p = (pointer)&msg.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&msg,"AUTOGEN: No valid Qt version found for target ","");
              psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
              std::__cxx11::string::_M_append((char *)&msg,(ulong)(psVar13->_M_dataplus)._M_p);
              std::__cxx11::string::append((char *)&msg);
              cmQtAutoGen::Tools_abi_cxx11_
                        (&version,(cmQtAutoGen *)(ulong)bVar19,moc,(!bVar20 && bVar5) && bVar10,
                         SUB81(in_R8,0));
              std::__cxx11::string::_M_append((char *)&msg,(ulong)version._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)version._M_dataplus._M_p != &version.field_2) {
                operator_delete(version._M_dataplus._M_p,version.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)&msg);
              __val = local_a0.second;
              if (local_a0.second == 0) {
                version._M_dataplus._M_p = (pointer)&version.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&version,"<QTVERSION>","")
                ;
              }
              else {
                cVar11 = '\x01';
                if (9 < local_a0.second) {
                  uVar15 = local_a0.second;
                  cVar7 = '\x04';
                  do {
                    cVar11 = cVar7;
                    if (uVar15 < 100) {
                      cVar11 = cVar11 + -2;
                      goto LAB_00376aad;
                    }
                    if (uVar15 < 1000) {
                      cVar11 = cVar11 + -1;
                      goto LAB_00376aad;
                    }
                    if (uVar15 < 10000) goto LAB_00376aad;
                    bVar5 = 99999 < uVar15;
                    uVar15 = uVar15 / 10000;
                    cVar7 = cVar11 + '\x04';
                  } while (bVar5);
                  cVar11 = cVar11 + '\x01';
                }
LAB_00376aad:
                version._M_dataplus._M_p = (pointer)&version.field_2;
                std::__cxx11::string::_M_construct((ulong)&version,cVar11);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (version._M_dataplus._M_p,(uint)version._M_string_length,__val);
              }
              pcVar14 = "Core";
              if ((!bVar20 && bVar6) && bVar9) {
                pcVar14 = "Widgets";
              }
              comp._M_dataplus._M_p = (pointer)&comp.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&comp,pcVar14,pcVar14 + (ulong)moc * 3 + 4);
              std::__cxx11::string::append((char *)&msg);
              std::__cxx11::string::_M_append((char *)&msg,(ulong)version._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&msg);
              std::__cxx11::string::_M_append((char *)&msg,(ulong)comp._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&msg);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)comp._M_dataplus._M_p != &comp.field_2) {
                operator_delete(comp._M_dataplus._M_p,comp.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)version._M_dataplus._M_p != &version.field_2) {
                operator_delete(version._M_dataplus._M_p,version.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)&msg);
              cmMakefile::IssueMessage(this_01->Makefile,AUTHOR_WARNING,&msg);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
            bVar8 = bVar8 && (bVar20 || bVar21);
            bVar9 = bVar9 && (bVar20 || bVar22);
            bVar10 = bVar10 && (bVar20 || bVar23);
            if ((bVar9 || bVar8) || bVar10) {
              this_02 = (cmQtAutoGenInitializer *)operator_new(0x618);
              in_R8 = (ulong)bVar8;
              cmQtAutoGenInitializer::cmQtAutoGenInitializer
                        (this_02,this,this_01,&local_a0.first,bVar8,bVar9,bVar10,globalAutogenTarget
                         ,globalAutoRccTarget);
              msg._M_dataplus._M_p = (pointer)this_02;
              std::
              vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
              ::
              emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                        ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                          *)this,(unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                                  *)&msg);
              std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
              ::~unique_ptr((unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                             *)&msg);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)rccExec._M_dataplus._M_p != &rccExec.field_2) {
              operator_delete(rccExec._M_dataplus._M_p,rccExec.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uicExec._M_dataplus._M_p != &uicExec.field_2) {
              operator_delete(uicExec._M_dataplus._M_p,uicExec.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)targetName._M_dataplus._M_p != &targetName.field_2) {
              operator_delete(targetName._M_dataplus._M_p,
                              targetName.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      ppcVar16 = ppcVar16 + 1;
    } while (ppcVar16 != ppcVar2);
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<cmLocalGenerator*> const& localGenerators)
{
  for (cmLocalGenerator* localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (cmSystemTools::IsOn(
            makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET"))) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        GlobalAutoGenTargets_.emplace(localGen, std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (cmSystemTools::IsOn(
            makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET"))) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        GlobalAutoRccTargets_.emplace(localGen, std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (cmGeneratorTarget* target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(kw().AUTOMOC);
      bool const uic = target->GetPropertyAsBool(kw().AUTOUIC);
      bool const rcc = target->GetPropertyAsBool(kw().AUTORCC);
      if (moc || uic || rcc) {
        std::string const mocExec =
          target->GetSafeProperty(kw().AUTOMOC_EXECUTABLE);
        std::string const uicExec =
          target->GetSafeProperty(kw().AUTOUIC_EXECUTABLE);
        std::string const rccExec =
          target->GetSafeProperty(kw().AUTORCC_EXECUTABLE);

        // We support Qt4, Qt5 and Qt6
        auto qtVersion = cmQtAutoGenInitializer::GetQtVersion(target);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          std::string msg = "AUTOGEN: No valid Qt version found for target ";
          msg += target->GetName();
          msg += ". ";
          msg += cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled);
          msg += " disabled.  Consider adding:\n";
          {
            std::string version = (qtVersion.second == 0)
              ? std::string("<QTVERSION>")
              : std::to_string(qtVersion.second);
            std::string comp = uicDisabled ? "Widgets" : "Core";
            msg += "  find_package(Qt";
            msg += version;
            msg += " COMPONENTS ";
            msg += comp;
            msg += ")\n";
          }
          msg += "to your CMakeLists.txt file.";
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          Initializers_.emplace_back(cm::make_unique<cmQtAutoGenInitializer>(
            this, target, qtVersion.first, mocIsValid, uicIsValid, rccIsValid,
            globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}